

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

nifti_image * nifti_image_read_bricks(char *hname,int nbricks,int *blist,nifti_brick_list *NBL)

{
  int iVar1;
  nifti_image *nim;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((hname == (char *)0x0) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nifti_image_read_bricks: bad params (%p,%p)\n",hname,NBL);
  }
  else if (nbricks < 1 && blist != (int *)0x0) {
    fprintf(_stderr,"** nifti_image_read_bricks: bad nbricks, %d\n",nbricks);
  }
  else {
    nim = nifti_image_read(hname,0);
    if (nim != (nifti_image *)0x0) {
      iVar1 = nifti_image_load_bricks(nim,nbricks,blist,NBL);
      if (0 < iVar1) {
        if (blist == (int *)0x0) {
          return nim;
        }
        if (2 < g_opts_0) {
          nifti_image_read_bricks_cold_1();
        }
        nim->nt = nbricks;
        nim->nw = 1;
        nim->nu = 1;
        nim->nv = 1;
        nim->dim[4] = nbricks;
        nim->dim[7] = 1;
        nim->dim[5] = 1;
        nim->dim[6] = 1;
        nim->nvox = 1;
        if (0 < nim->dim[0]) {
          sVar2 = 1;
          uVar3 = 0;
          do {
            sVar2 = sVar2 * (long)nim->dim[uVar3 + 1];
            uVar3 = uVar3 + 1;
          } while ((uint)nim->dim[0] != uVar3);
          nim->nvox = sVar2;
        }
        uVar3 = 4;
        do {
          uVar4 = (uint)uVar3;
          if (1 < nim->dim[uVar3]) goto LAB_0010876b;
          uVar3 = (ulong)(uVar4 - 1);
        } while (2 < uVar4);
        uVar3 = 1;
LAB_0010876b:
        if (2 < g_opts_0) {
          fprintf(_stderr,"+d ndim = %d -> %d\n",(ulong)(uint)nim->ndim,uVar3);
          fprintf(_stderr," --> (%d,%d,%d,%d,%d,%d,%d)\n",(ulong)(uint)nim->nx,(ulong)(uint)nim->ny,
                  (ulong)(uint)nim->nz,(ulong)(uint)nim->nt,(ulong)(uint)nim->nu,
                  (ulong)(uint)nim->nv,(ulong)(uint)nim->nw);
        }
        nim->ndim = (int)uVar3;
        nim->dim[0] = (int)uVar3;
        return nim;
      }
      nifti_image_free(nim);
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image *nifti_image_read_bricks(const char * hname, int nbricks,
                                     const int * blist, nifti_brick_list * NBL)
{
   nifti_image * nim;

   if( !hname || !NBL ){
      fprintf(stderr,"** nifti_image_read_bricks: bad params (%p,%p)\n",
              hname, (void *)NBL);
      return NULL;
   }

   if( blist && nbricks <= 0 ){
      fprintf(stderr,"** nifti_image_read_bricks: bad nbricks, %d\n", nbricks);
      return NULL;
   }

   nim = nifti_image_read(hname, 0);  /* read header, but not data */

   if( !nim ) return NULL;   /* errors were already printed */

   /* if we fail, free image and return */
   if( nifti_image_load_bricks(nim, nbricks, blist, NBL) <= 0 ){
      nifti_image_free(nim);
      return NULL;
   }

   if( blist ) update_nifti_image_for_brick_list(nim, nbricks);

   return nim;
}